

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,QPalette>::emplace<QPalette_const&>
          (QHash<QByteArray,_QPalette> *this,QByteArray *key,QPalette *args)

{
  bool bVar1;
  QHash<QByteArray,_QPalette> *in_RDX;
  QPalette *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QHash<QByteArray,_QPalette> copy;
  QHash<QByteArray,_QPalette> *in_stack_ffffffffffffff98;
  QHash<QByteArray,_QPalette> *in_stack_ffffffffffffffa0;
  QPalette *in_stack_ffffffffffffffa8;
  piter local_30;
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<QByteArray,_QPalette>::isDetached(in_stack_ffffffffffffffa0);
  if (bVar1) {
    bVar1 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QPalette>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)(in_RDI->d).d);
    if (bVar1) {
      QPalette::QPalette(&local_18,(QPalette *)in_RDX);
      local_30 = (piter)QHash<QByteArray,_QPalette>::emplace_helper<QPalette>(in_RDX,in_RDI,in_RSI);
      QPalette::~QPalette(&local_18);
    }
    else {
      local_30 = (piter)emplace_helper<QPalette_const&>(in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QHash<QByteArray,_QPalette>::QHash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<QByteArray,_QPalette>::detach(in_stack_ffffffffffffffa0);
    local_30 = (piter)emplace_helper<QPalette_const&>(in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    QHash<QByteArray,_QPalette>::~QHash(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_30;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }